

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O1

data_ptr_t __thiscall duckdb::Allocator::AllocateData(Allocator *this,idx_t size)

{
  data_ptr_t pdVar1;
  InternalException *this_00;
  OutOfMemoryException *this_01;
  string local_40;
  
  if (size >> 0x30 != 0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "Requested allocation size of %llu is out of range - maximum allocation size is %llu"
               ,"");
    InternalException::InternalException<unsigned_long,unsigned_long>
              (this_00,&local_40,size,0x1000000000000);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pdVar1 = (*this->allocate_function)
                     ((this->private_data).
                      super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
                      .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>._M_head_impl,
                      size);
  if (pdVar1 != (data_ptr_t)0x0) {
    return pdVar1;
  }
  this_01 = (OutOfMemoryException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Failed to allocate block of %llu bytes (bad allocation)","");
  OutOfMemoryException::OutOfMemoryException<unsigned_long>(this_01,&local_40,size);
  __cxa_throw(this_01,&OutOfMemoryException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

data_ptr_t Allocator::AllocateData(idx_t size) {
	D_ASSERT(size > 0);
	if (size >= MAXIMUM_ALLOC_SIZE) {
		D_ASSERT(false);
		throw InternalException("Requested allocation size of %llu is out of range - maximum allocation size is %llu",
		                        size, MAXIMUM_ALLOC_SIZE);
	}
	auto result = allocate_function(private_data.get(), size);
#ifdef DEBUG
	D_ASSERT(private_data);
	if (private_data->free_type != AllocatorFreeType::DOES_NOT_REQUIRE_FREE) {
		private_data->debug_info->AllocateData(result, size);
	}
#endif
	if (!result) {
		throw OutOfMemoryException("Failed to allocate block of %llu bytes (bad allocation)", size);
	}
	return result;
}